

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O2

int __thiscall cmCPackRPMGenerator::InitializeInternal(cmCPackRPMGenerator *this)

{
  bool bVar1;
  int iVar2;
  cmValue cVar3;
  string *psVar4;
  string packageName;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CPACK_PACKAGING_INSTALL_PREFIX",(allocator<char> *)&local_38);
  cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_58,"/usr");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CPACK_SET_DESTDIR",(allocator<char> *)&local_38);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_58);
  bVar1 = cmIsOff((cmValue)0x1b51ba);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"CPACK_SET_DESTDIR",(allocator<char> *)&local_38);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_58,"I_ON");
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CPACK_PACKAGE_NAME",(allocator<char> *)&local_38);
  cVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (cVar3.Value != (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"CPACK_PACKAGE_NAME",&local_59);
    psVar4 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_38);
    if (psVar4 == (string *)0x0) {
      psVar4 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)&local_58,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_38);
    local_38._M_dataplus._M_p._0_1_ = 0x20;
    local_59 = (allocator<char>)0x2d;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_58._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_58._M_dataplus._M_p + local_58._M_string_length),(char *)&local_38,
               (char *)&local_59);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"CPACK_PACKAGE_NAME",&local_59);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CPACK_PACKAGE_FILE_NAME",(allocator<char> *)&local_38);
  cVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (cVar3.Value != (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"CPACK_PACKAGE_FILE_NAME",&local_59);
    psVar4 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_38);
    if (psVar4 == (string *)0x0) {
      psVar4 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)&local_58,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_38);
    local_38._M_dataplus._M_p._0_1_ = 0x20;
    local_59 = (allocator<char>)0x2d;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_58._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_58._M_dataplus._M_p + local_58._M_string_length),(char *)&local_38,
               (char *)&local_59);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"CPACK_PACKAGE_FILE_NAME",&local_59);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  iVar2 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
  return iVar2;
}

Assistant:

int cmCPackRPMGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_PACKAGING_INSTALL_PREFIX", "/usr");
  if (cmIsOff(this->GetOption("CPACK_SET_DESTDIR"))) {
    this->SetOption("CPACK_SET_DESTDIR", "I_ON");
  }
  /* Replace space in CPACK_PACKAGE_NAME in order to avoid
   * rpmbuild scream on unwanted space in filename issue
   * Moreover RPM file do not usually embed space in filename
   */
  if (this->GetOption("CPACK_PACKAGE_NAME")) {
    std::string packageName = this->GetOption("CPACK_PACKAGE_NAME");
    std::replace(packageName.begin(), packageName.end(), ' ', '-');
    this->SetOption("CPACK_PACKAGE_NAME", packageName);
  }
  /* same for CPACK_PACKAGE_FILE_NAME */
  if (this->GetOption("CPACK_PACKAGE_FILE_NAME")) {
    std::string packageName = this->GetOption("CPACK_PACKAGE_FILE_NAME");
    std::replace(packageName.begin(), packageName.end(), ' ', '-');
    this->SetOption("CPACK_PACKAGE_FILE_NAME", packageName);
  }
  return this->Superclass::InitializeInternal();
}